

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLDocument::DeepCopy(XMLDocument *this,XMLDocument *target)

{
  XMLNode *addThis;
  undefined8 local_20;
  XMLNode *node;
  XMLDocument *target_local;
  XMLDocument *this_local;
  
  if (target != this) {
    Clear(target);
    for (local_20 = XMLNode::FirstChild(&this->super_XMLNode); local_20 != (XMLNode *)0x0;
        local_20 = XMLNode::NextSibling(local_20)) {
      addThis = XMLNode::DeepClone(local_20,target);
      XMLNode::InsertEndChild(&target->super_XMLNode,addThis);
    }
  }
  return;
}

Assistant:

void XMLDocument::DeepCopy(XMLDocument* target) const
{
	TIXMLASSERT(target);
    if (target == this) {
        return; // technically success - a no-op.
    }

	target->Clear();
	for (const XMLNode* node = this->FirstChild(); node; node = node->NextSibling()) {
		target->InsertEndChild(node->DeepClone(target));
	}
}